

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O0

void __thiscall Moc::parsePrivateProperty(Moc *this,ClassDef *def,PropertyMode mode)

{
  Moc *in_RSI;
  PropertyDef *in_RDI;
  long in_FS_OFFSET;
  PropertyDef propDef;
  undefined8 in_stack_fffffffffffffe58;
  parameter_type t;
  Moc *this_00;
  undefined1 local_178 [368];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  Parser::next((Parser *)in_RDI,(Token)((ulong)in_stack_fffffffffffffe58 >> 0x20));
  this_00 = (Moc *)(local_178 + 0x18);
  memset(this_00,0xaa,0x158);
  PropertyDef::PropertyDef(in_RDI);
  t = (parameter_type)local_178;
  parsePropertyAccessor(in_RSI);
  QByteArray::operator=(&in_RDI->name,&t->name);
  QByteArray::~QByteArray((QByteArray *)0x1537fe);
  Parser::next((Parser *)in_RDI,(Token)((ulong)t >> 0x20));
  QList<PropertyDef>::size((QList<PropertyDef> *)&in_RSI[1].includePath);
  createPropertyDef(this_00,in_RDI,(int)((ulong)t >> 0x20),(PropertyMode)t);
  QList<PropertyDef>::operator+=((QList<PropertyDef> *)in_RDI,t);
  PropertyDef::~PropertyDef(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Moc::parsePrivateProperty(ClassDef *def, Moc::PropertyMode mode)
{
    next(LPAREN);
    PropertyDef propDef;
    propDef.inPrivateClass = parsePropertyAccessor();

    next(COMMA);

    createPropertyDef(propDef, int(def->propertyList.size()), mode);

    def->propertyList += propDef;
}